

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

nanoseconds __thiscall anon_unknown.dwarf_e23c::AudioState::getClockNoLock(AudioState *this)

{
  ALuint AVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  ALint status;
  ALCint64SOFT devtimes [2];
  ALint status_1;
  uint local_3c;
  long local_38;
  long lStack_30;
  int local_1c;
  
  if ((anonymous_namespace)::alcGetInteger64vSOFT == (code *)0x0) {
    if (this->mBufferDataSize == 0) {
      lVar8 = (this->mCurrentPts).__r;
      AVar1 = this->mSource;
      if (AVar1 != 0) {
        if ((anonymous_namespace)::alGetSourcei64vSOFT == (code *)0x0) {
          alGetSourcei(AVar1,0x1025,&local_3c);
          local_38 = (ulong)local_3c << 0x20;
          lStack_30 = 0;
        }
        else {
          (*(anonymous_namespace)::alGetSourcei64vSOFT)(AVar1,0x1200,&local_38);
        }
        alGetSourcei(this->mSource,0x1015,&local_3c);
        alGetSourcei(this->mSource,0x1010,&local_1c);
        if (local_1c != 0x1014) {
          lVar6 = (local_38 /
                  (long)((this->mCodecCtx)._M_t.
                         super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                         .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_rate)
                  * 0x1dcd65;
          lVar5 = lVar6 + 0x7fffff;
          if (-1 < lVar6) {
            lVar5 = lVar6;
          }
          lVar8 = (lVar5 >> 0x17) + (long)(int)local_3c * -20000000 + lVar8;
        }
        if (local_1c != 0x1012) {
          lStack_30 = 0;
        }
        lVar8 = lVar8 - lStack_30;
      }
      if (lVar8 < 1) {
        return (nanoseconds)0;
      }
      return (nanoseconds)lVar8;
    }
    if ((anonymous_namespace)::alGetSourcei64vSOFT == (code *)0x0) {
      alGetSourcei(this->mSource,0x1025,&local_3c);
      local_38 = (ulong)local_3c << 0x20;
      lStack_30 = 0;
    }
    else {
      (*(anonymous_namespace)::alGetSourcei64vSOFT)(this->mSource,0x1200,&local_38);
    }
    alGetSourcei(this->mSource,0x1010,&local_3c);
    if ((local_3c & 0xfffffffe) == 0x1012) {
      lVar5 = (local_38 /
              (long)((this->mCodecCtx)._M_t.
                     super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                     .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_rate) *
              0x1dcd65;
      lVar8 = lVar5 + 0x7fffff;
      if (-1 < lVar5) {
        lVar8 = lVar5;
      }
      return (nanoseconds)((lVar8 >> 0x17) + ((this->mDeviceStartTime).__r - lStack_30));
    }
    uVar2 = (this->mWritePos).super___atomic_base<unsigned_long>._M_i;
    uVar3 = (this->mReadPos).super___atomic_base<unsigned_long>._M_i;
    sVar7 = 0;
    if (uVar2 < uVar3) {
      sVar7 = this->mBufferDataSize;
    }
    local_38 = (this->mCurrentPts).__r;
    lStack_30 = (long)((((uVar2 - uVar3) + sVar7) / (ulong)this->mFrameSize) * 1000000000) /
                (long)((this->mCodecCtx)._M_t.
                       super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                       .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_rate;
  }
  else {
    uVar4 = alcGetCurrentContext();
    uVar4 = alcGetContextsDevice(uVar4);
    local_38 = 0;
    lStack_30 = 0;
    (*(anonymous_namespace)::alcGetInteger64vSOFT)(uVar4,0x1602,2,&local_38);
    lStack_30 = lStack_30 + (this->mDeviceStartTime).__r;
  }
  return (nanoseconds)(local_38 - lStack_30);
}

Assistant:

nanoseconds AudioState::getClockNoLock()
{
    // The audio clock is the timestamp of the sample currently being heard.
    if(alcGetInteger64vSOFT)
    {
        // If device start time = min, we aren't playing yet.
        if(mDeviceStartTime == nanoseconds::min())
            return nanoseconds::zero();

        // Get the current device clock time and latency.
        auto device = alcGetContextsDevice(alcGetCurrentContext());
        ALCint64SOFT devtimes[2]{0,0};
        alcGetInteger64vSOFT(device, ALC_DEVICE_CLOCK_LATENCY_SOFT, 2, devtimes);
        auto latency = nanoseconds{devtimes[1]};
        auto device_time = nanoseconds{devtimes[0]};

        // The clock is simply the current device time relative to the recorded
        // start time. We can also subtract the latency to get more a accurate
        // position of where the audio device actually is in the output stream.
        return device_time - mDeviceStartTime - latency;
    }

    if(mBufferDataSize > 0)
    {
        if(mDeviceStartTime == nanoseconds::min())
            return nanoseconds::zero();

        /* With a callback buffer and no device clock, mDeviceStartTime is
         * actually the timestamp of the first sample frame played. The audio
         * clock, then, is that plus the current source offset.
         */
        ALint64SOFT offset[2];
        if(alGetSourcei64vSOFT)
            alGetSourcei64vSOFT(mSource, AL_SAMPLE_OFFSET_LATENCY_SOFT, offset);
        else
        {
            ALint ioffset;
            alGetSourcei(mSource, AL_SAMPLE_OFFSET, &ioffset);
            offset[0] = ALint64SOFT{ioffset} << 32;
            offset[1] = 0;
        }
        /* NOTE: The source state must be checked last, in case an underrun
         * occurs and the source stops between getting the state and retrieving
         * the offset+latency.
         */
        ALint status;
        alGetSourcei(mSource, AL_SOURCE_STATE, &status);

        nanoseconds pts{};
        if(status == AL_PLAYING || status == AL_PAUSED)
            pts = mDeviceStartTime - nanoseconds{offset[1]} +
                duration_cast<nanoseconds>(fixed32{offset[0] / mCodecCtx->sample_rate});
        else
        {
            /* If the source is stopped, the pts of the next sample to be heard
             * is the pts of the next sample to be buffered, minus the amount
             * already in the buffer ready to play.
             */
            const size_t woffset{mWritePos.load(std::memory_order_acquire)};
            const size_t roffset{mReadPos.load(std::memory_order_relaxed)};
            const size_t readable{((woffset >= roffset) ? woffset : (mBufferDataSize+woffset)) -
                roffset};

            pts = mCurrentPts - nanoseconds{seconds{readable/mFrameSize}}/mCodecCtx->sample_rate;
        }

        return pts;
    }

    /* The source-based clock is based on 4 components:
     * 1 - The timestamp of the next sample to buffer (mCurrentPts)
     * 2 - The length of the source's buffer queue
     *     (AudioBufferTime*AL_BUFFERS_QUEUED)
     * 3 - The offset OpenAL is currently at in the source (the first value
     *     from AL_SAMPLE_OFFSET_LATENCY_SOFT)
     * 4 - The latency between OpenAL and the DAC (the second value from
     *     AL_SAMPLE_OFFSET_LATENCY_SOFT)
     *
     * Subtracting the length of the source queue from the next sample's
     * timestamp gives the timestamp of the sample at the start of the source
     * queue. Adding the source offset to that results in the timestamp for the
     * sample at OpenAL's current position, and subtracting the source latency
     * from that gives the timestamp of the sample currently at the DAC.
     */
    nanoseconds pts{mCurrentPts};
    if(mSource)
    {
        ALint64SOFT offset[2];
        if(alGetSourcei64vSOFT)
            alGetSourcei64vSOFT(mSource, AL_SAMPLE_OFFSET_LATENCY_SOFT, offset);
        else
        {
            ALint ioffset;
            alGetSourcei(mSource, AL_SAMPLE_OFFSET, &ioffset);
            offset[0] = ALint64SOFT{ioffset} << 32;
            offset[1] = 0;
        }
        ALint queued, status;
        alGetSourcei(mSource, AL_BUFFERS_QUEUED, &queued);
        alGetSourcei(mSource, AL_SOURCE_STATE, &status);

        /* If the source is AL_STOPPED, then there was an underrun and all
         * buffers are processed, so ignore the source queue. The audio thread
         * will put the source into an AL_INITIAL state and clear the queue
         * when it starts recovery.
         */
        if(status != AL_STOPPED)
        {
            pts -= AudioBufferTime*queued;
            pts += duration_cast<nanoseconds>(fixed32{offset[0] / mCodecCtx->sample_rate});
        }
        /* Don't offset by the latency if the source isn't playing. */
        if(status == AL_PLAYING)
            pts -= nanoseconds{offset[1]};
    }

    return std::max(pts, nanoseconds::zero());
}